

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::array_matcher<pstore::exchange::import_ns::callbacks>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
           *__return_storage_ptr__,array_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser,maybe<char,_void> *ch)

{
  byte bVar1;
  int iVar2;
  _Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
  _Var3;
  bool bVar4;
  byte *pbVar5;
  error_code eVar6;
  error_code local_28;
  
  if (ch->valid_ == false) {
LAB_00118e91:
    local_28._M_cat = get_error_category();
    local_28._M_value = 1;
    matcher<pstore::exchange::import_ns::callbacks>::set_error
              (&this->super_matcher<pstore::exchange::import_ns::callbacks>,parser,&local_28);
LAB_00118eae:
    *(undefined8 *)
     &(__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
         = 1;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
    .
    super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
    ._M_head_impl = (matcher<pstore::exchange::import_ns::callbacks> *)0x0;
    __return_storage_ptr__->second = true;
  }
  else {
    pbVar5 = (byte *)maybe<char,_void>::operator->(ch);
    iVar2 = (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_;
    if (4 < iVar2 - 1U) goto LAB_00118eae;
    bVar1 = *pbVar5;
    switch(iVar2) {
    case 1:
      assert_failed("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x4c6);
    case 2:
      if (bVar1 != 0x5b) {
        assert_failed("c == \'[\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x4a3);
      }
      eVar6 = exchange::import_ns::callbacks::begin_array(&parser->callbacks_);
      local_28._M_cat = eVar6._M_cat;
      local_28._M_value = eVar6._M_value;
      bVar4 = matcher<pstore::exchange::import_ns::callbacks>::set_error
                        (&this->super_matcher<pstore::exchange::import_ns::callbacks>,parser,
                         &local_28);
      if (bVar4) goto LAB_00118eae;
      (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 3;
      _Var3._M_head_impl =
           (parser->singletons_)._M_t.
           super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
           ._M_head_impl;
      *(undefined4 *)((long)&(_Var3._M_head_impl)->terminal + 8) = 2;
      ((_Var3._M_head_impl)->terminal).__align =
           (anon_struct_8_0_00000001_for___align)&PTR__matcher_001662d8;
      local_28._M_value = (uint)local_28._M_value >> 8;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
      .
      super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
      .
      super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>,_false>
           = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>,_false>
              )0x0;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
      ._M_head_impl =
           (matcher<pstore::exchange::import_ns::callbacks> *)&(_Var3._M_head_impl)->terminal;
LAB_00118e6f:
      local_28._M_value = local_28._M_value << 8;
      __return_storage_ptr__->second = true;
      break;
    case 3:
      if (bVar1 == 0x5d) goto LAB_00118e84;
    case 4:
      (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 5;
      _Var3._M_head_impl =
           (parser->singletons_)._M_t.
           super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
           ._M_head_impl;
      *(undefined4 *)((long)&(_Var3._M_head_impl)->root + 8) = 2;
      ((_Var3._M_head_impl)->root).__align =
           (anon_struct_8_0_00000001_for___align)&PTR__matcher_00166318;
      *(undefined1 *)((long)&(_Var3._M_head_impl)->root + 0xc) = 0;
      local_28._M_value = (uint)local_28._M_value._1_3_ << 8;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
      .
      super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
      .
      super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>,_false>
           = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>,_false>
              )0x0;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
      ._M_head_impl = (matcher<pstore::exchange::import_ns::callbacks> *)&(_Var3._M_head_impl)->root
      ;
      __return_storage_ptr__->second = false;
      break;
    case 5:
      if (bVar1 < 0x2d) {
        if ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0) {
          _Var3._M_head_impl =
               (parser->singletons_)._M_t.
               super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
               .
               super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
               ._M_head_impl;
          *(undefined4 *)((long)&(_Var3._M_head_impl)->terminal + 8) = 2;
          ((_Var3._M_head_impl)->terminal).__align =
               (anon_struct_8_0_00000001_for___align)&PTR__matcher_001662d8;
          local_28._M_value = (uint)local_28._M_value._1_3_ << 8;
          (__return_storage_ptr__->first)._M_t.
          super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
          .
          super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
          .
          super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>,_false>
               = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>,_false>
                  )0x0;
          (__return_storage_ptr__->first)._M_t.
          super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
          .
          super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
          ._M_head_impl =
               (matcher<pstore::exchange::import_ns::callbacks> *)&(_Var3._M_head_impl)->terminal;
          __return_storage_ptr__->second = false;
          break;
        }
        if ((ulong)bVar1 == 0x2c) {
          (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ =
               ((parser->extensions_ & array_trailing_comma) == none) + 3;
          _Var3._M_head_impl =
               (parser->singletons_)._M_t.
               super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
               .
               super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
               ._M_head_impl;
          *(undefined4 *)((long)&(_Var3._M_head_impl)->terminal + 8) = 2;
          ((_Var3._M_head_impl)->terminal).__align =
               (anon_struct_8_0_00000001_for___align)&PTR__matcher_001662d8;
          local_28._M_value = (int)local_28._M_value._1_3_;
          (__return_storage_ptr__->first)._M_t.
          super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
          .
          super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
          .
          super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>,_false>
               = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>,_false>
                  )0x0;
          (__return_storage_ptr__->first)._M_t.
          super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
          .
          super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
          ._M_head_impl =
               (matcher<pstore::exchange::import_ns::callbacks> *)&(_Var3._M_head_impl)->terminal;
          goto LAB_00118e6f;
        }
      }
      if (bVar1 != 0x5d) goto LAB_00118e91;
LAB_00118e84:
      end_array(this,parser);
      goto LAB_00118eae;
    }
    local_28._M_cat = (error_category *)0x0;
    std::
    unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
    ::~unique_ptr((unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                   *)&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            array_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (!ch) {
                    this->set_error (parser, error_code::expected_array_member);
                    return {nullptr, true};
                }
                char const c = *ch;
                switch (this->get_state ()) {
                case start_state:
                    PSTORE_ASSERT (c == '[');
                    if (this->set_error (parser, parser.callbacks ().begin_array ())) {
                        break;
                    }
                    this->set_state (first_object_state);
                    // Match this character and consume whitespace before the object (or close
                    // bracket).
                    return {this->make_whitespace_matcher (parser), true};

                case first_object_state:
                    if (c == ']') {
                        this->end_array (parser);
                        break;
                    }
                    PSTORE_FALLTHROUGH;
                case object_state:
                    this->set_state (comma_state);
                    return {this->make_root_matcher (parser), false};
                    break;
                case comma_state:
                    if (isspace (c)) {
                        // just consume whitespace before a comma.
                        return {this->make_whitespace_matcher (parser), false};
                    }
                    switch (c) {
                    case ',':
                        this->set_state (
                            (parser.extension_enabled (extensions::array_trailing_comma))
                                ? first_object_state
                                : object_state);
                        return {this->make_whitespace_matcher (parser), true};
                    case ']': this->end_array (parser); break;
                    default: this->set_error (parser, error_code::expected_array_member); break;
                    }
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                return {nullptr, true};
            }